

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

void clearexp(void)

{
  expentry *__ptr;
  expentry *e1;
  
  while (__ptr = ehead.tqh_first, ehead.tqh_first != (expentry *)0x0) {
    if (((ehead.tqh_first)->eentry).tqe_next == (expentry *)0x0) {
      ehead.tqh_last = ((ehead.tqh_first)->eentry).tqe_prev;
    }
    else {
      ((((ehead.tqh_first)->eentry).tqe_next)->eentry).tqe_prev =
           ((ehead.tqh_first)->eentry).tqe_prev;
    }
    *(__ptr->eentry).tqe_prev = (__ptr->eentry).tqe_next;
    free(__ptr->fun);
    free(__ptr);
  }
  return;
}

Assistant:

static void
clearexp(void)
{
	struct expentry	*e1 = NULL;

	while (!TAILQ_EMPTY(&ehead)) {
		e1 = TAILQ_FIRST(&ehead);
		TAILQ_REMOVE(&ehead, e1, eentry);
		free(e1->fun);
		free(e1);
	}
	return;
}